

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# infix_iterator.h
# Opt level: O0

infix_ostream_iterator<double,_char,_std::char_traits<char>_> * __thiscall
Nova::infix_ostream_iterator<double,_char,_std::char_traits<char>_>::operator=
          (infix_ostream_iterator<double,_char,_std::char_traits<char>_> *this,double *item)

{
  double *item_local;
  infix_ostream_iterator<double,_char,_std::char_traits<char>_> *this_local;
  
  if (((this->first_elem & 1U) == 0) && (this->delimiter != (char *)0x0)) {
    std::operator<<(this->os,this->delimiter);
  }
  std::ostream::operator<<(this->os,*item);
  this->first_elem = false;
  return this;
}

Assistant:

infix_ostream_iterator<T,charT,traits>& operator=(T const &item)
    {
        // Here's the only real change from ostream_iterator:
        // Normally, the '*os << item;' would come before the 'if'.
        if (!first_elem && delimiter != 0) *os << delimiter;
        *os << item;
        first_elem = false;
        return *this;
    }